

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_size(int handle,LONGLONG *filesize)

{
  FILE *__stream;
  int iVar1;
  long __off;
  long lVar2;
  FILE *diskfile;
  off_t position2;
  off_t position1;
  LONGLONG *filesize_local;
  int handle_local;
  
  __stream = (FILE *)handleTable[handle].fileptr;
  __off = ftell(__stream);
  if (__off < 0) {
    filesize_local._4_4_ = 0x74;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      lVar2 = ftell(__stream);
      if (lVar2 < 0) {
        filesize_local._4_4_ = 0x74;
      }
      else {
        iVar1 = fseek(__stream,__off,0);
        if (iVar1 == 0) {
          *filesize = lVar2;
          filesize_local._4_4_ = 0;
        }
        else {
          filesize_local._4_4_ = 0x74;
        }
      }
    }
    else {
      filesize_local._4_4_ = 0x74;
    }
  }
  return filesize_local._4_4_;
}

Assistant:

int file_size(int handle, LONGLONG *filesize)
/*
  return the size of the file in bytes
*/
{
    OFF_T position1,position2;
    FILE *diskfile;

    diskfile = handleTable[handle].fileptr;

#if defined(_MSC_VER) && (_MSC_VER >= 1400)
 
/* call the VISUAL C++ version of the routines which support */
/*  Large Files (> 2GB) if they are supported (since VC 8.0)  */

    position1 = _ftelli64(diskfile);   /* save current postion */
    if (position1 < 0)
        return(SEEK_ERROR);

    if (_fseeki64(diskfile, 0, 2) != 0)  /* seek to end of file */
        return(SEEK_ERROR);

    position2 = _ftelli64(diskfile);     /* get file size */
    if (position2 < 0)
        return(SEEK_ERROR);

    if (_fseeki64(diskfile, position1, 0) != 0)  /* seek back to original pos */
        return(SEEK_ERROR);

#elif _FILE_OFFSET_BITS - 0 == 64

/* call the newer ftello and fseeko routines , which support */
/*  Large Files (> 2GB) if they are supported.  */

    position1 = ftello(diskfile);   /* save current postion */
    if (position1 < 0)
        return(SEEK_ERROR);

    if (fseeko(diskfile, 0, 2) != 0)  /* seek to end of file */
        return(SEEK_ERROR);

    position2 = ftello(diskfile);     /* get file size */
    if (position2 < 0)
        return(SEEK_ERROR);

    if (fseeko(diskfile, position1, 0) != 0)  /* seek back to original pos */
        return(SEEK_ERROR);

#else

    position1 = ftell(diskfile);   /* save current postion */
    if (position1 < 0)
        return(SEEK_ERROR);

    if (fseek(diskfile, 0, 2) != 0)  /* seek to end of file */
        return(SEEK_ERROR);

    position2 = ftell(diskfile);     /* get file size */
    if (position2 < 0)
        return(SEEK_ERROR);

    if (fseek(diskfile, position1, 0) != 0)  /* seek back to original pos */
        return(SEEK_ERROR);

#endif

    *filesize = (LONGLONG) position2;
    
    return(0);
}